

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O3

Bool tidyNodeGetText(TidyDoc tdoc,TidyNode tnod,TidyBuffer *outbuf)

{
  int iVar1;
  Bool BVar2;
  StreamOut *pSVar3;
  
  BVar2 = no;
  if (outbuf != (TidyBuffer *)0x0 && (tnod != (TidyNode)0x0 && tdoc != (TidyDoc)0x0)) {
    pSVar3 = prvTidyBufferOutput((TidyDocImpl *)tdoc,outbuf,tdoc[0x96]._opaque,tdoc[0x90]._opaque);
    iVar1 = tdoc[0xe2]._opaque;
    *(StreamOut **)(tdoc + 0xcfa) = pSVar3;
    if ((tdoc[0xe6]._opaque == 0) || (iVar1 != 0)) {
      prvTidyPPrintTree((TidyDocImpl *)tdoc,0,0,(Node *)tnod);
    }
    else {
      prvTidyPPrintXMLTree((TidyDocImpl *)tdoc,0,0,(Node *)tnod);
    }
    prvTidyPFlushLine((TidyDocImpl *)tdoc,0);
    *(undefined8 *)(tdoc + 0xcfa) = 0;
    (**(code **)(**(long **)(tdoc + 0xd20) + 0x10))(*(long **)(tdoc + 0xd20),pSVar3);
    BVar2 = yes;
  }
  return BVar2;
}

Assistant:

Bool TIDY_CALL tidyNodeGetText( TidyDoc tdoc, TidyNode tnod, TidyBuffer* outbuf )
{
  TidyDocImpl* doc = tidyDocToImpl( tdoc );
  Node* nimp = tidyNodeToImpl( tnod );
  if ( doc && nimp && outbuf )
  {
      uint outenc     = cfg( doc, TidyOutCharEncoding );
      uint nl         = cfg( doc, TidyNewline );
      StreamOut* out  = TY_(BufferOutput)( doc, outbuf, outenc, nl );
      Bool xmlOut     = cfgBool( doc, TidyXmlOut );
      Bool xhtmlOut   = cfgBool( doc, TidyXhtmlOut );

      doc->docOut = out;
      if ( xmlOut && !xhtmlOut )
          TY_(PPrintXMLTree)( doc, NORMAL, 0, nimp );
      else
          TY_(PPrintTree)( doc, NORMAL, 0, nimp );

      TY_(PFlushLine)( doc, 0 );
      doc->docOut = NULL;

      TidyDocFree( doc, out );
      return yes;
  }
  return no;
}